

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# clip.cpp
# Opt level: O0

bool image_manipulation::bicubic_resize
               (clip_image_u8 *img,clip_image_u8 *dst,int target_width,int target_height)

{
  float fVar1;
  byte bVar2;
  int iVar3;
  uint uVar4;
  int iVar5;
  byte *pbVar6;
  float *pfVar7;
  reference pvVar8;
  int in_ECX;
  int in_EDX;
  int *in_RSI;
  int *in_RDI;
  double dVar9;
  uint8_t Cc2;
  float ty;
  float tx;
  float dy;
  float dx;
  int y;
  int x;
  int jj;
  int k;
  int j;
  int i;
  float a3;
  float a2;
  float a1;
  float a0;
  float d3;
  float d2;
  float d0;
  float C [5];
  float Cc;
  int ny;
  int nx;
  int in_stack_fffffffffffffefc;
  vector<unsigned_char,_std::allocator<unsigned_char>_> *this;
  undefined4 in_stack_ffffffffffffff18;
  undefined4 in_stack_ffffffffffffff1c;
  vector<unsigned_char,_std::allocator<unsigned_char>_> *in_stack_ffffffffffffff20;
  vector<unsigned_char,_std::allocator<unsigned_char>_> *pvVar10;
  float local_8c;
  float local_88;
  float local_84;
  value_type local_7d;
  float local_7c;
  float local_78;
  float local_74;
  float local_70;
  int local_6c;
  int local_68;
  int local_64;
  int local_60;
  int local_5c;
  int local_58;
  float local_54;
  float local_50;
  float local_4c;
  float local_48;
  float local_44;
  float local_40;
  float local_3c;
  float local_38 [5];
  float local_24;
  int local_20;
  int local_1c;
  int local_18;
  int local_14;
  int *local_10;
  int *local_8;
  
  local_1c = *in_RDI;
  local_20 = in_RDI[1];
  *in_RSI = in_EDX;
  in_RSI[1] = in_ECX;
  local_18 = in_ECX;
  local_14 = in_EDX;
  local_10 = in_RSI;
  local_8 = in_RDI;
  std::vector<unsigned_char,_std::allocator<unsigned_char>_>::resize
            (in_stack_ffffffffffffff20,CONCAT44(in_stack_ffffffffffffff1c,in_stack_ffffffffffffff18)
            );
  local_78 = (float)local_1c / (float)local_14;
  local_7c = (float)local_20 / (float)local_18;
  for (local_58 = 0; local_58 < local_18; local_58 = local_58 + 1) {
    for (local_5c = 0; local_5c < local_14; local_5c = local_5c + 1) {
      local_68 = (int)(local_78 * (float)local_5c);
      local_6c = (int)(local_7c * (float)local_58);
      local_70 = local_78 * (float)local_5c + -(float)local_68;
      local_74 = local_7c * (float)local_58 + -(float)local_6c;
      for (local_60 = 0; local_60 < 3; local_60 = local_60 + 1) {
        for (local_64 = 0; local_64 < 4; local_64 = local_64 + 1) {
          this = (vector<unsigned_char,_std::allocator<unsigned_char>_> *)(local_8 + 2);
          in_stack_fffffffffffffefc =
               clip((int)((ulong)this >> 0x20),(int)this,in_stack_fffffffffffffefc);
          in_stack_fffffffffffffefc = in_stack_fffffffffffffefc * local_1c;
          iVar3 = clip((int)((ulong)this >> 0x20),(int)this,in_stack_fffffffffffffefc);
          pbVar6 = std::vector<unsigned_char,_std::allocator<unsigned_char>_>::operator[]
                             (this,(long)((in_stack_fffffffffffffefc + iVar3) * 3 + local_60));
          uVar4 = (uint)*pbVar6;
          pvVar10 = (vector<unsigned_char,_std::allocator<unsigned_char>_> *)(local_8 + 2);
          iVar3 = clip((int)((ulong)this >> 0x20),(int)this,in_stack_fffffffffffffefc);
          iVar3 = iVar3 * local_1c;
          iVar5 = clip((int)((ulong)this >> 0x20),(int)this,in_stack_fffffffffffffefc);
          pbVar6 = std::vector<unsigned_char,_std::allocator<unsigned_char>_>::operator[]
                             (pvVar10,(long)((iVar3 + iVar5) * 3 + local_60));
          local_3c = (float)(int)(uVar4 - *pbVar6);
          pvVar10 = (vector<unsigned_char,_std::allocator<unsigned_char>_> *)(local_8 + 2);
          iVar3 = clip((int)((ulong)this >> 0x20),(int)this,in_stack_fffffffffffffefc);
          iVar3 = iVar3 * local_1c;
          iVar5 = clip((int)((ulong)this >> 0x20),(int)this,in_stack_fffffffffffffefc);
          pbVar6 = std::vector<unsigned_char,_std::allocator<unsigned_char>_>::operator[]
                             (pvVar10,(long)((iVar3 + iVar5) * 3 + local_60));
          bVar2 = *pbVar6;
          pvVar10 = (vector<unsigned_char,_std::allocator<unsigned_char>_> *)(local_8 + 2);
          iVar3 = clip((int)((ulong)this >> 0x20),(int)this,in_stack_fffffffffffffefc);
          iVar3 = iVar3 * local_1c;
          iVar5 = clip((int)((ulong)this >> 0x20),(int)this,in_stack_fffffffffffffefc);
          pbVar6 = std::vector<unsigned_char,_std::allocator<unsigned_char>_>::operator[]
                             (pvVar10,(long)((iVar3 + iVar5) * 3 + local_60));
          local_40 = (float)(int)((uint)bVar2 - (uint)*pbVar6);
          pvVar10 = (vector<unsigned_char,_std::allocator<unsigned_char>_> *)(local_8 + 2);
          iVar3 = clip((int)((ulong)this >> 0x20),(int)this,in_stack_fffffffffffffefc);
          iVar3 = iVar3 * local_1c;
          iVar5 = clip((int)((ulong)this >> 0x20),(int)this,in_stack_fffffffffffffefc);
          pbVar6 = std::vector<unsigned_char,_std::allocator<unsigned_char>_>::operator[]
                             (pvVar10,(long)((iVar3 + iVar5) * 3 + local_60));
          bVar2 = *pbVar6;
          pvVar10 = (vector<unsigned_char,_std::allocator<unsigned_char>_> *)(local_8 + 2);
          iVar3 = clip((int)((ulong)this >> 0x20),(int)this,in_stack_fffffffffffffefc);
          iVar3 = iVar3 * local_1c;
          iVar5 = clip((int)((ulong)this >> 0x20),(int)this,in_stack_fffffffffffffefc);
          pbVar6 = std::vector<unsigned_char,_std::allocator<unsigned_char>_>::operator[]
                             (pvVar10,(long)((iVar3 + iVar5) * 3 + local_60));
          local_44 = (float)(int)((uint)bVar2 - (uint)*pbVar6);
          pvVar10 = (vector<unsigned_char,_std::allocator<unsigned_char>_> *)(local_8 + 2);
          iVar3 = clip((int)((ulong)this >> 0x20),(int)this,in_stack_fffffffffffffefc);
          iVar3 = iVar3 * local_1c;
          iVar5 = clip((int)((ulong)this >> 0x20),(int)this,in_stack_fffffffffffffefc);
          pbVar6 = std::vector<unsigned_char,_std::allocator<unsigned_char>_>::operator[]
                             (pvVar10,(long)((iVar3 + iVar5) * 3 + local_60));
          local_38[local_64] =
               (local_44 * 0.16666667 + (local_3c * -0.16666667 - local_40 * 0.5)) * local_70 *
               local_70 * local_70 +
               (local_3c * 0.5 + local_40 * 0.5) * local_70 * local_70 +
               (local_44 * -0.16666667 + local_3c * -0.33333334 + local_40) * local_70 +
               (float)*pbVar6;
          local_3c = local_38[0] - local_38[1];
          local_40 = local_38[2] - local_38[1];
          local_44 = local_38[3] - local_38[1];
          local_48 = local_38[1];
          local_4c = local_44 * -0.16666667 + local_3c * -0.33333334 + local_40;
          local_50 = local_3c * 0.5 + local_40 * 0.5;
          local_54 = local_44 * 0.16666667 + (local_3c * -0.16666667 - local_40 * 0.5);
          local_24 = local_54 * local_74 * local_74 * local_74 +
                     local_50 * local_74 * local_74 + local_4c * local_74 + local_38[1];
          dVar9 = std::round((double)(ulong)(uint)local_24);
          local_84 = SUB84(dVar9,0);
          local_88 = 0.0;
          pfVar7 = std::max<float>(&local_84,&local_88);
          local_8c = 255.0;
          pfVar7 = std::min<float>(pfVar7,&local_8c);
          fVar1 = *pfVar7;
          local_7d = (value_type)(int)fVar1;
          pvVar8 = std::vector<unsigned_char,_std::allocator<unsigned_char>_>::operator[]
                             ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)
                              (local_10 + 2),(long)((local_58 * local_14 + local_5c) * 3 + local_60)
                             );
          *pvVar8 = (value_type)(int)fVar1;
        }
      }
    }
  }
  return true;
}

Assistant:

static bool bicubic_resize(const clip_image_u8 & img, clip_image_u8 & dst, int target_width, int target_height) {
        const int nx = img.nx;
        const int ny = img.ny;

        dst.nx = target_width;
        dst.ny = target_height;
        dst.buf.resize(3 * target_width * target_height);

        float Cc;
        float C[5];
        float d0, d2, d3, a0, a1, a2, a3;
        int i, j, k, jj;
        int x, y;
        float dx, dy;
        float tx, ty;

        tx = (float)nx / (float)target_width;
        ty = (float)ny / (float)target_height;

        // Bicubic interpolation; adapted from ViT.cpp, inspired from :
        //    -> https://github.com/yglukhov/bicubic-interpolation-image-processing/blob/master/libimage.c#L36
        //    -> https://en.wikipedia.org/wiki/Bicubic_interpolation

        for (i = 0; i < target_height; i++) {
            for (j = 0; j < target_width; j++) {
                x = (int)(tx * j);
                y = (int)(ty * i);

                dx = tx * j - x;
                dy = ty * i - y;

                for (k = 0; k < 3; k++) {
                    for (jj = 0; jj <= 3; jj++) {
                        d0 = img.buf[(clip(y - 1 + jj, 0, ny - 1) * nx + clip(x - 1, 0, nx - 1)) * 3 + k] - img.buf[(clip(y - 1 + jj, 0, ny - 1) * nx + clip(x, 0, nx - 1)) * 3 + k];
                        d2 = img.buf[(clip(y - 1 + jj, 0, ny - 1) * nx + clip(x + 1, 0, nx - 1)) * 3 + k] - img.buf[(clip(y - 1 + jj, 0, ny - 1) * nx + clip(x, 0, nx - 1)) * 3 + k];
                        d3 = img.buf[(clip(y - 1 + jj, 0, ny - 1) * nx + clip(x + 2, 0, nx - 1)) * 3 + k] - img.buf[(clip(y - 1 + jj, 0, ny - 1) * nx + clip(x, 0, nx - 1)) * 3 + k];
                        a0 = img.buf[(clip(y - 1 + jj, 0, ny - 1) * nx + clip(x, 0, nx - 1)) * 3 + k];

                        a1 = -1.0 / 3 * d0 + d2 - 1.0 / 6 * d3;
                        a2 =  1.0 / 2 * d0 +      1.0 / 2 * d2;
                        a3 = -1.0 / 6 * d0 -      1.0 / 2 * d2 + 1.0 / 6 * d3;

                        C[jj] = a0 + a1 * dx + a2 * dx * dx + a3 * dx * dx * dx;

                        d0 = C[0] - C[1];
                        d2 = C[2] - C[1];
                        d3 = C[3] - C[1];
                        a0 = C[1];
                        a1 = -1.0 / 3 * d0 + d2 - 1.0 / 6 * d3;
                        a2 =  1.0 / 2 * d0 +      1.0 / 2 * d2;
                        a3 = -1.0 / 6 * d0 -      1.0 / 2 * d2 + 1.0 / 6 * d3;
                        Cc = a0 + a1 * dy + a2 * dy * dy + a3 * dy * dy * dy;

                        const uint8_t Cc2 = std::min(std::max(std::round(Cc), 0.0f), 255.0f);
                        dst.buf[(i * target_width + j) * 3 + k] = float(Cc2);
                    }
                }
            }
        }

        return true;
    }